

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

bool __thiscall gl4cts::TextureViewTestViewSampling::executeTest(TextureViewTestViewSampling *this)

{
  undefined4 *puVar1;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  void *pvVar9;
  long lVar10;
  uchar *puVar11;
  TestError *this_00;
  ulong uVar12;
  bool bVar13;
  uint n_mipmap;
  uint uVar14;
  uint uVar15;
  int *piVar16;
  ulong uVar17;
  uint n_face;
  uint uVar18;
  uint uVar19;
  float fVar20;
  Vec4 reference_color;
  undefined1 local_1b8 [8];
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ios_base local_140 [272];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar8 + 8))(0x84c0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glActiveTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1151);
  (**(code **)(lVar8 + 0xb8))(this->m_iteration_view_texture_target,this->m_view_to_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1154);
  (**(code **)(lVar8 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1158);
  (**(code **)(lVar8 + 0x1680))(this->m_po_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x115c);
  (**(code **)(lVar8 + 0x78))(0x8d40,this->m_fbo_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1161);
  (**(code **)(lVar8 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_result_to_id,0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glFramebufferTexture2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1164);
  pvVar9 = operator_new__((ulong)this->m_iteration_parent_texture_n_samples << 6);
  uVar14 = this->m_iteration_view_texture_minlayer;
  uVar18 = this->m_iteration_view_texture_numlayers;
  bVar13 = true;
  if (uVar14 < uVar18 + uVar14) {
    GVar2 = this->m_iteration_view_texture_target;
    bVar13 = true;
    uVar19 = uVar14;
    do {
      if (GVar2 == 0x9009) {
LAB_00a2f2b8:
        n_face = uVar14 / 6;
        n_mipmap = uVar14 % 6;
        uVar12 = (ulong)(uVar14 - uVar19) / 6;
        uVar15 = (uVar14 - uVar19) % 6;
      }
      else {
        uVar15 = 0;
        uVar12 = (ulong)uVar14;
        n_mipmap = 0;
        n_face = uVar14;
        if (GVar2 == 0x8513) goto LAB_00a2f2b8;
      }
      if (this->m_po_z_float_location != -1) {
        if ((GVar2 == 0x8513) || (GVar2 == 0x9009)) {
          fVar20 = 0.0;
          if (6 < uVar18) goto LAB_00a2f326;
        }
        else {
          fVar20 = 0.0;
          if (1 < uVar18) {
LAB_00a2f326:
            if ((GVar2 == 0x9009) || (GVar2 == 0x8513)) {
              uVar18 = uVar18 / 6;
            }
            else {
              uVar12 = (ulong)((int)uVar12 - uVar19);
            }
            fVar20 = (float)uVar12 / (float)(uVar18 - 1);
          }
        }
        (**(code **)(lVar8 + 0x14e0))(fVar20);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"glUniform1f() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x11a9);
      }
      if (this->m_po_z_int_location != -1) {
        (**(code **)(lVar8 + 0x14f0))
                  (this->m_po_z_int_location,uVar14 - this->m_iteration_view_texture_minlayer);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"glUniform1i() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x11b1);
      }
      if (this->m_po_n_face_location != -1) {
        (**(code **)(lVar8 + 0x14f0))(this->m_po_n_face_location,uVar15);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"glUniform1i() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x11b7);
      }
      uVar18 = this->m_iteration_view_texture_minlevel;
      if ((uVar18 < this->m_iteration_view_texture_numlevels + uVar18) && (uVar19 = uVar18, bVar13))
      {
        do {
          if (this->m_po_lod_location != -1) {
            (**(code **)(lVar8 + 0x14e0))((float)(uVar19 - uVar18));
            dVar7 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar7,"glUniform1i() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x11c3);
          }
          if (this->m_iteration_parent_texture_n_samples == 0) {
            uVar12 = 0;
          }
          else {
            uVar18 = 0;
            uVar17 = 0;
            do {
              getReferenceColor((TextureViewTestViewSampling *)local_1b8,(uint)this,n_face,n_mipmap,
                                uVar19);
              puVar1 = (undefined4 *)((long)pvVar9 + (ulong)uVar18 * 4);
              *puVar1 = local_1b8._0_4_;
              puVar1[1] = local_1b8._4_4_;
              puVar1[2] = uStack_1b0;
              puVar1[3] = uStack_1ac;
              uVar17 = uVar17 + 1;
              uVar12 = (ulong)this->m_iteration_parent_texture_n_samples;
              uVar18 = uVar18 + 4;
            } while (uVar17 < uVar12);
          }
          (**(code **)(lVar8 + 0x15a8))(this->m_po_reference_colors_location,uVar12,pvVar9);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"glUniform4fv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x11d3);
          (**(code **)(lVar8 + 0xb8))(this->m_iteration_view_texture_target,this->m_view_to_id);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"glBindTexture() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x11d7);
          (**(code **)(lVar8 + 0x30))(4);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"glBeginTransformFeedback() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x11de);
          (**(code **)(lVar8 + 0x538))(0xe,0,1);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"glDrawArrays() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x11e1);
          (**(code **)(lVar8 + 0x638))();
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"glEndTransformFeedback() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x11e4);
          lVar10 = (**(code **)(lVar8 + 0xcf8))(0x8c8e,35000);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"glMapBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x11ee);
          if (lVar10 == 0) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"glMapBuffer() call succeeded but the pointer returned is NULL",
                       (char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x11f1);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          if (bVar13) {
            piVar16 = (int *)(lVar10 + 0xc);
            uVar12 = 0;
            do {
              iVar6 = piVar16[-2];
              iVar3 = piVar16[-1];
              iVar4 = *piVar16;
              if (piVar16[-3] != 1) {
                local_1b8 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&uStack_1b0,"Invalid data was sampled in vertex shader stage."
                           ,0x30);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
                std::ios_base::~ios_base(local_140);
                bVar13 = false;
              }
              if (iVar6 != 1) {
                local_1b8 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&uStack_1b0,
                           "Invalid data was sampled in tessellation control shader stage.",0x3e);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
                std::ios_base::~ios_base(local_140);
                bVar13 = false;
              }
              if (iVar3 != 1) {
                local_1b8 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&uStack_1b0,
                           "Invalid data was sampled in tessellation evaluation shader stage.",0x41)
                ;
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
                std::ios_base::~ios_base(local_140);
                bVar13 = false;
              }
              if (iVar4 != 1) {
                local_1b8 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&uStack_1b0,
                           "Invalid data was sampled in geometry shader stage.",0x32);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
                std::ios_base::~ios_base(local_140);
                bVar13 = false;
                break;
              }
              if (4 < uVar12) break;
              uVar12 = uVar12 + 1;
              piVar16 = piVar16 + 4;
            } while (bVar13);
          }
          (**(code **)(lVar8 + 0x1670))(0x8c8e);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"glUnmapBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x122a);
          puVar11 = (uchar *)operator_new__((ulong)(this->m_reference_texture_width *
                                                    this->m_reference_texture_height * 4));
          this->m_result_data = puVar11;
          (**(code **)(lVar8 + 0xb8))(0xde1,this->m_result_to_id);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"glBindTexture() call failed for GL_TEXTURE_2D texture target.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x1231);
          (**(code **)(lVar8 + 0xaa0))(0xde1,0,0x1908,0x1401,this->m_result_data);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"glGetTexImage() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x1234);
          uVar18 = this->m_reference_texture_height;
          if (uVar18 != 0) {
            uVar15 = this->m_reference_texture_width;
            bVar5 = true;
            uVar12 = 0;
            do {
              if ((bool)(uVar15 != 0 & bVar5)) {
                iVar6 = uVar15 * (int)uVar12;
                puVar11 = this->m_result_data;
                uVar18 = 0;
                uVar17 = 0;
                while ((((puVar11[(ulong)uVar18 + (ulong)(uint)(iVar6 * 4)] == 0xff &&
                         (puVar11[(ulong)uVar18 + (ulong)(uint)(iVar6 * 4) + 1] == 0xff)) &&
                        (puVar11[(ulong)uVar18 + (ulong)(uint)(iVar6 * 4) + 2] == 0xff)) &&
                       (puVar11[(ulong)uVar18 + (ulong)(uint)(iVar6 * 4) + 3] == 0xff))) {
                  uVar17 = uVar17 + 1;
                  if ((uVar15 <= uVar17) || (uVar18 = uVar18 + 4, !bVar5)) goto LAB_00a2f9fb;
                }
                local_1b8 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&uStack_1b0,"Invalid data was sampled at (",0x1d);
                std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1b0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
                std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&uStack_1b0,") in fragment shader stage.",0x1b);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
                std::ios_base::~ios_base(local_140);
                uVar15 = this->m_reference_texture_width;
                bVar5 = false;
LAB_00a2f9fb:
                uVar18 = this->m_reference_texture_height;
              }
              uVar12 = uVar12 + 1;
            } while ((uVar12 < uVar18) && (bVar5));
            if (!bVar5) {
              bVar13 = false;
            }
          }
          if (this->m_result_data != (uchar *)0x0) {
            operator_delete__(this->m_result_data);
          }
          this->m_result_data = (uchar *)0x0;
          uVar19 = uVar19 + 1;
          uVar18 = this->m_iteration_view_texture_minlevel;
        } while ((uVar19 < this->m_iteration_view_texture_numlevels + uVar18) && (bVar13 != false));
      }
      uVar14 = uVar14 + 1;
      uVar19 = this->m_iteration_view_texture_minlayer;
      uVar18 = this->m_iteration_view_texture_numlayers;
    } while ((uVar14 < uVar18 + uVar19) && (bVar13));
  }
  operator_delete__(pvVar9);
  return bVar13;
}

Assistant:

bool TextureViewTestViewSampling::executeTest()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Bind the view to zero texture unit */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

	gl.bindTexture(m_iteration_view_texture_target, m_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* Bind the buffer object to zero TF binding point */
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Activate the test program */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Update draw framebuffer configuration so that the test's fragment shader draws
	 * to the result texture */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_result_to_id, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	/* Allocate enough space to hold reference color data for all sample s*/
	float* reference_color_data = new float[m_iteration_parent_texture_n_samples * sizeof(float) * 4 /* rgba */];

	/* Iterate through the layer/face/mipmap hierarchy. For each iteration, we
	 * potentially need to update relevant uniforms controlling the sampling process
	 * the test program object performs.
	 */
	bool is_view_cm_cma = (m_iteration_view_texture_target == GL_TEXTURE_CUBE_MAP ||
						   m_iteration_view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

	for (unsigned int n_current_layer = m_iteration_view_texture_minlayer;
		 n_current_layer < (m_iteration_view_texture_minlayer + m_iteration_view_texture_numlayers) && result;
		 n_current_layer++)
	{
		unsigned int n_texture_face  = 0;
		unsigned int n_texture_layer = 0;
		unsigned int n_view_face	 = 0;
		unsigned int n_view_layer	= 0;

		if (is_view_cm_cma)
		{
			n_texture_face  = n_current_layer % 6;										 /* faces */
			n_texture_layer = n_current_layer / 6;										 /* faces */
			n_view_face		= (n_current_layer - m_iteration_view_texture_minlayer) % 6; /* faces */
			n_view_layer	= (n_current_layer - m_iteration_view_texture_minlayer) / 6; /* faces */
		}
		else
		{
			/* Only cube-map and cube-map array textures consist of faces. */
			n_texture_face  = 0;
			n_texture_layer = n_current_layer;
			n_view_face		= 0;
			n_view_layer	= n_current_layer;
		}

		if (m_po_z_float_location != -1)
		{
			float z = 0.0f;

			if (((false == is_view_cm_cma) && (m_iteration_view_texture_numlayers > 1)) ||
				((true == is_view_cm_cma) && (m_iteration_view_texture_numlayers > 6)))
			{
				if (is_view_cm_cma)
				{
					z = float(n_view_layer) / float(m_iteration_view_texture_numlayers / 6 - 1);
				}
				else
				{
					if (m_iteration_view_texture_numlayers > 1)
					{
						/* The program will be sampling a view so make sure that layer the shader accesses
						 * is relative to how our view was configured */
						z = float(n_view_layer - m_iteration_view_texture_minlayer) /
							float(m_iteration_view_texture_numlayers - 1);
					}
					else
					{
						/* z should stay at 0 */
					}
				}
			}
			else
			{
				/* z should stay at 0.0 */
			}

			gl.uniform1f(m_po_z_float_location, z);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f() call failed.");
		}

		if (m_po_z_int_location != -1)
		{
			DE_ASSERT(!is_view_cm_cma);

			gl.uniform1i(m_po_z_int_location, n_current_layer - m_iteration_view_texture_minlayer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");
		}

		if (m_po_n_face_location != -1)
		{
			gl.uniform1i(m_po_n_face_location, n_view_face);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");
		}

		for (unsigned int n_mipmap = m_iteration_view_texture_minlevel;
			 n_mipmap < (m_iteration_view_texture_minlevel + m_iteration_view_texture_numlevels) && result; n_mipmap++)
		{
			if (m_po_lod_location != -1)
			{
				/* The program will be sampling a view so make sure that LOD the shader accesses
				 * is relative to how our view was configured.
				 */
				gl.uniform1f(m_po_lod_location, (float)(n_mipmap - m_iteration_view_texture_minlevel));
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");
			}

			/* Update local reference color data storage */
			for (unsigned int n_sample = 0; n_sample < m_iteration_parent_texture_n_samples; ++n_sample)
			{
				tcu::Vec4 reference_color = getReferenceColor(n_texture_layer, n_texture_face, n_mipmap, n_sample);

				reference_color_data[4 /* rgba */ * n_sample + 0] = reference_color.x();
				reference_color_data[4 /* rgba */ * n_sample + 1] = reference_color.y();
				reference_color_data[4 /* rgba */ * n_sample + 2] = reference_color.z();
				reference_color_data[4 /* rgba */ * n_sample + 3] = reference_color.w();
			}

			/* Upload it to GPU */
			gl.uniform4fv(m_po_reference_colors_location, m_iteration_parent_texture_n_samples, reference_color_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed.");

			/* Bind the texture view to sample from */
			gl.bindTexture(m_iteration_view_texture_target, m_view_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

			/* Draw a single patch. Given the rendering pipeline we've defined in the
			 * test program object, this should give us a nice full-screen quad, as well
			 * as 6*4 ints XFBed out, describing whether the view was sampled correctly.
			 */
			gl.beginTransformFeedback(GL_TRIANGLES);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
			{
				gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
			}
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

			/* In order to verify if the texel data was sampled correctly, we need to do two things:
			 *
			 * 1) Verify buffer object contents;
			 * 2) Make sure that all texels of current render-target are vec4(1).
			 *
			 */
			const int* bo_storage_ptr = (const int*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");
			if (bo_storage_ptr == NULL)
			{
				TCU_FAIL("glMapBuffer() call succeeded but the pointer returned is NULL");
			}

			/* The rendering pipeline should have written 6 vertices * 4 ints to the BO.
			 * The integers are set to 1 if the sampled texels were found valid, 0 otherwise,
			 * and are arranged in the following order:
			 *
			 * 1) Result of sampling in vertex shader stage;
			 * 2) Result of sampling in tessellation control shader stage;
			 * 3) Result of sampling in tessellation evaluation shader stage;
			 * 4) Result of sampling in geometry shader stage;
			 */
			for (unsigned int n_vertex = 0; n_vertex < 6 /* as per comment */ && result; ++n_vertex)
			{
				const int* vertex_data_ptr = bo_storage_ptr + n_vertex * 4 /* as per comment */;
				int		   vs_result	   = vertex_data_ptr[0];
				int		   tc_result	   = vertex_data_ptr[1];
				int		   te_result	   = vertex_data_ptr[2];
				int		   gs_result	   = vertex_data_ptr[3];

				if (vs_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled in vertex shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}

				if (tc_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid data was sampled in tessellation control shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}

				if (te_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid data was sampled in tessellation evaluation shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}

				if (gs_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled in geometry shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}
			} /* for (all vertices) */

			/* Unmap the BO */
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

			/* Read texels rendered by the fragment shader. The texture attached uses
			 * GL_RGBA8 internalformat.*/
			m_result_data = new unsigned char[m_reference_texture_width * m_reference_texture_height * 4 /* RGBA */];

			gl.bindTexture(GL_TEXTURE_2D, m_result_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed for GL_TEXTURE_2D texture target.");

			gl.getTexImage(GL_TEXTURE_2D, 0 /* level */, GL_RGBA, GL_UNSIGNED_BYTE, m_result_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage() call failed.");

			/* The test fails if any of the fragments is not equal to vec4(1) */
			bool fs_result = true;

			for (unsigned int y = 0; y < m_reference_texture_height && fs_result; ++y)
			{
				const unsigned char* row_ptr = m_result_data + m_reference_texture_width * y * 4 /* RGBA */;

				for (unsigned int x = 0; x < m_reference_texture_width && fs_result; ++x)
				{
					const unsigned char* pixel_ptr = row_ptr + x * 4 /* RGBA */;

					if (pixel_ptr[0] != 255 || pixel_ptr[1] != 255 || pixel_ptr[2] != 255 || pixel_ptr[3] != 255)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled at (" << x << ", " << y
										   << ") "
											  "in fragment shader stage."
										   << tcu::TestLog::EndMessage;

						fs_result = false;
					}
				} /* for (all columns) */
			}	 /* for (all rows) */

			if (!fs_result)
			{
				result = false;
			}

			/* Done - we can release the buffer at this point */
			delete[] m_result_data;
			m_result_data = DE_NULL;
		} /* for (all mip-maps) */
	}	 /* for (all texture layers) */

	/* Release the reference color data buffer */
	delete[] reference_color_data;
	reference_color_data = DE_NULL;

	/* All done */
	return result;
}